

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall gmlc::networking::TcpConnection::startReceive(TcpConnection *this)

{
  element_type *peVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  __int_type_conflict3 _Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  ConnectionStates exp;
  undefined8 local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  __int_type_conflict3 local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  if (((this->triggerhalt)._M_base._M_i & 1U) != 0) {
    concurrency::TriggerVariable::trigger(&this->receivingHalt);
    return;
  }
  if ((this->state)._M_i == PRESTART) {
    concurrency::TriggerVariable::activate(&this->receivingHalt);
    concurrency::TriggerVariable::activate(&this->connected);
    LOCK();
    (this->state)._M_i = WAITING;
    UNLOCK();
  }
  exp = WAITING;
  bVar10 = std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::compare_exchange_strong
                     (&this->state,&exp,OPERATING,seq_cst);
  if (bVar10) {
    if (((this->receivingHalt).activated._M_base._M_i & 1U) == 0) {
      concurrency::TriggerVariable::activate(&this->receivingHalt);
    }
    if (((this->triggerhalt)._M_base._M_i & 1U) == 0) {
      peVar1 = (this->socket_).
               super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar2 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = (this->residBufferSize).super___atomic_base<unsigned_long>._M_i;
      pcVar3 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      _Var5 = (this->residBufferSize).super___atomic_base<unsigned_long>._M_i;
      std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<gmlc::networking::TcpConnection,void>
                ((__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_78,
                 (__weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = operator_new(0x10);
      uVar6 = (undefined4)local_78;
      uVar7 = local_78._4_4_;
      uVar8 = a_Stack_70[0]._M_pi._0_4_;
      uVar9 = a_Stack_70[0]._M_pi._4_4_;
      a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78 = 0;
      *(undefined4 *)local_58._M_unused._0_8_ = uVar6;
      *(undefined4 *)((long)local_58._M_unused._0_8_ + 4) = uVar7;
      *(undefined4 *)((long)local_58._M_unused._0_8_ + 8) = uVar8;
      *(undefined4 *)((long)local_58._M_unused._0_8_ + 0xc) = uVar9;
      pcStack_40 = std::
                   _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpConnection.cpp:43:17)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpConnection.cpp:43:17)>
                 ::_M_manager;
      (*peVar1->_vptr_Socket[3])(peVar1,pcVar2 + local_60,(long)pcVar4 - (long)(pcVar3 + _Var5));
      CLI::std::_Function_base::~_Function_base((_Function_base *)&local_58);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
      if (((this->triggerhalt)._M_base._M_i & 1U) == 0) {
        return;
      }
      (*((this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_Socket[0xb])();
      return;
    }
    LOCK();
    (this->state)._M_i = HALTED;
    UNLOCK();
  }
  else if (exp == OPERATING) {
    return;
  }
  concurrency::TriggerVariable::trigger(&this->receivingHalt);
  return;
}

Assistant:

void TcpConnection::startReceive()
{
    if (triggerhalt) {
        receivingHalt.trigger();
        return;
    }
    if (state == ConnectionStates::PRESTART) {
        receivingHalt.activate();
        connected.activate();
        state = ConnectionStates::WAITING;
    }
    ConnectionStates exp = ConnectionStates::WAITING;
    if (state.compare_exchange_strong(exp, ConnectionStates::OPERATING)) {
        if (!receivingHalt.isActive()) {
            receivingHalt.activate();
        }
        if (!triggerhalt) {
            socket_->async_read_some(
                data.data() + residBufferSize,
                data.size() - residBufferSize,
                [ptr = shared_from_this()](
                    const std::error_code& err, size_t bytes) {
                    ptr->handle_read(err, bytes);
                });
            if (triggerhalt) {
                // cancel previous operation if triggerhalt is now active
                socket_->cancel();
                // receivingHalt.trigger();
            }
        } else {
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        }
    } else if (exp != ConnectionStates::OPERATING) {
        /*either halted or closed*/
        receivingHalt.trigger();
    }
}